

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

char * yang_read_string(char *input,char *output,int size,int offset,int indent)

{
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  LY_ERR *pLVar3;
  int iVar4;
  int iVar5;
  undefined8 uStack_38;
  
  iVar2 = 0;
  iVar4 = 0;
  uStack_38 = in_RAX;
  do {
    uStack_38 = CONCAT44(offset,(undefined4)uStack_38);
    if (size <= iVar2) {
      output[offset] = '\0';
      if ((offset != size) &&
         (output = (char *)realloc(output,(long)(offset + 1)), output == (char *)0x0)) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        output = (char *)0x0;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_string");
      }
      return output;
    }
    cVar1 = input[iVar2];
    if (cVar1 == '\t') {
LAB_0014ca4e:
      output[offset] = cVar1;
      iVar4 = iVar4 + 1;
      iVar5 = iVar2;
    }
    else if (cVar1 == '\\') {
      cVar1 = input[(long)iVar2 + 1];
      iVar5 = iVar2 + 1;
      if (cVar1 == '\\') {
        output[offset] = '\\';
      }
      else if (cVar1 == 't') {
        output[offset] = '\t';
        iVar4 = iVar4 + 1;
      }
      else {
        if (cVar1 == 'n') {
          iVar4 = offset - iVar4;
          output[iVar4] = '\n';
          iVar2 = iVar2 + 2;
          goto LAB_0014ca36;
        }
        if ((iVar5 == size) || (cVar1 != '\"')) {
          ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,input);
          return (char *)0x0;
        }
        output[offset] = '\"';
      }
    }
    else {
      if (cVar1 == ' ') goto LAB_0014ca4e;
      if (cVar1 == '\n') {
        iVar4 = offset - iVar4;
        output[iVar4] = '\n';
        iVar2 = iVar2 + 1;
LAB_0014ca36:
        uStack_38 = CONCAT44(iVar4,(undefined4)uStack_38);
        iVar2 = read_indent(input,indent,size,iVar2,(int *)((long)&uStack_38 + 4),output);
      }
      else {
        output[offset] = cVar1;
      }
      iVar4 = 0;
      iVar5 = iVar2;
    }
    iVar2 = iVar5 + 1;
    offset = uStack_38._4_4_ + 1;
  } while( true );
}

Assistant:

char *
yang_read_string(const char *input, char *output, int size, int offset, int indent) {
    int i = 0, out_index = offset, space = 0;

    while (i < size) {
        switch (input[i]) {
        case '\n':
            out_index -= space;
            output[out_index] = '\n';
            space = 0;
            i = read_indent(input, indent, size, i + 1, &out_index, output);
            break;
        case ' ':
        case '\t':
            output[out_index] = input[i];
            ++space;
            break;
        case '\\':
            if (input[i + 1] == 'n') {
                out_index -= space;
                output[out_index] = '\n';
                space = 0;
                i = read_indent(input, indent, size, i + 2, &out_index, output);
            } else if (input[i + 1] == 't') {
                output[out_index] = '\t';
                ++i;
                ++space;
            } else if (input[i + 1] == '\\') {
                output[out_index] = '\\';
                ++i;
            } else if ((i + 1) != size && input[i + 1] == '"') {
                output[out_index] = '"';
                ++i;
            } else {
                /* backslash must not be followed by any other character */
                LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, input);
                return NULL;
            }
            break;
        default:
            output[out_index] = input[i];
            space = 0;
            break;
        }
        ++i;
        ++out_index;
    }
    output[out_index] = '\0';
    if (size != out_index) {
        output = realloc(output, out_index + 1);
        if (!output) {
            LOGMEM;
            return NULL;
        }
    }
    return output;
}